

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void av1_compute_stats_highbd_avx2
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  int in_EDI;
  int in_stack_00000028;
  int in_stack_00000030;
  int64_t *in_stack_00000038;
  undefined4 in_stack_00000040;
  int in_stack_0000007c;
  int16_t *in_stack_00000080;
  int16_t *in_stack_00000088;
  uint8_t *in_stack_00000090;
  uint8_t *in_stack_00000098;
  int in_stack_000000a4;
  undefined4 in_stack_000000dc;
  int64_t *in_stack_000000e0;
  aom_bit_depth_t in_stack_000000e8;
  int in_stack_000020a8;
  int in_stack_000020ac;
  int in_stack_000020b0;
  int in_stack_000020b4;
  uint8_t *in_stack_000020b8;
  uint8_t *in_stack_000020c0;
  int in_stack_00005848;
  int in_stack_0000584c;
  int in_stack_00005850;
  int in_stack_00005854;
  uint8_t *in_stack_00005858;
  uint8_t *in_stack_00005860;
  undefined4 in_stack_ffffffffffffff8c;
  aom_bit_depth_t in_stack_ffffffffffffff90;
  
  if (in_EDI == 7) {
    compute_stats_highbd_win7_opt_avx2
              (in_stack_00005860,in_stack_00005858,in_stack_00005854,in_stack_00005850,
               in_stack_0000584c,in_stack_00005848,in_stack_00000028,in_stack_00000030,
               in_stack_00000038,(int64_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_00000040),
               in_stack_ffffffffffffff90);
  }
  else if (in_EDI == 5) {
    compute_stats_highbd_win5_opt_avx2
              (in_stack_000020c0,in_stack_000020b8,in_stack_000020b4,in_stack_000020b0,
               in_stack_000020ac,in_stack_000020a8,in_stack_00000028,in_stack_00000030,
               in_stack_00000038,(int64_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_00000040),
               in_stack_ffffffffffffff90);
  }
  else {
    av1_compute_stats_highbd_c
              (in_stack_000000a4,in_stack_00000098,in_stack_00000090,in_stack_00000088,
               in_stack_00000080,in_stack_0000007c,v_end,dgd_stride,src_stride,(int)M,(int)H,
               (int64_t *)CONCAT44(in_stack_000000dc,bit_depth),in_stack_000000e0,in_stack_000000e8)
    ;
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_avx2(int wiener_win, const uint8_t *dgd8,
                                   const uint8_t *src8, int16_t *dgd_avg,
                                   int16_t *src_avg, int h_start, int h_end,
                                   int v_start, int v_end, int dgd_stride,
                                   int src_stride, int64_t *M, int64_t *H,
                                   aom_bit_depth_t bit_depth) {
  if (wiener_win == WIENER_WIN) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win7_opt_avx2(dgd8, src8, h_start, h_end, v_start,
                                       v_end, dgd_stride, src_stride, M, H,
                                       bit_depth);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win5_opt_avx2(dgd8, src8, h_start, h_end, v_start,
                                       v_end, dgd_stride, src_stride, M, H,
                                       bit_depth);
  } else {
    av1_compute_stats_highbd_c(wiener_win, dgd8, src8, dgd_avg, src_avg,
                               h_start, h_end, v_start, v_end, dgd_stride,
                               src_stride, M, H, bit_depth);
  }
}